

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

SQInteger __thiscall SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  SQInteger *pSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar6 = (long)curr + (-0xe0 - (long)this) >> 3;
  if (this->_nlineinfos < 1) {
    lVar3 = 0;
  }
  else {
    lVar4 = this->_nlineinfos + -1;
    lVar7 = 0;
    lVar8 = lVar4;
    do {
      lVar3 = (lVar8 - lVar7 >> 1) + lVar7;
      lVar1 = this->_lineinfos[lVar3]._op;
      if (lVar6 < lVar1) {
        lVar8 = lVar3 + -1;
LAB_0011b18a:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if ((lVar1 < lVar6) && ((lVar4 <= lVar3 || (this->_lineinfos[lVar3 + 1]._op < lVar6)))) {
          lVar7 = lVar3 + 1;
          goto LAB_0011b18a;
        }
      }
    } while ((!bVar2) && (lVar7 <= lVar8));
  }
  if (0 < lVar3) {
    pSVar5 = &this->_lineinfos[lVar3]._op;
    do {
      if (*pSVar5 < lVar6) goto LAB_0011b1cd;
      pSVar5 = pSVar5 + -2;
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
    lVar3 = 0;
  }
LAB_0011b1cd:
  return this->_lineinfos[lVar3]._line;
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr)
{
    SQInteger op = (SQInteger)(curr-_instructions);
    SQInteger line=_lineinfos[0]._line;
    SQInteger low = 0;
    SQInteger high = _nlineinfos - 1;
    SQInteger mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        SQInteger curop = _lineinfos[mid]._op;
        if(curop > op)
        {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    return line;
}